

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# TTSnapObjects.h
# Opt level: O3

void TTD::NSSnapObjects::
     StdExtractSetKindSpecificInfo<TTD::NSSnapObjects::SnapHeapArgumentsInfo*,(TTD::NSSnapObjects::SnapObjectType)13>
               (SnapObject *snpObject,SnapHeapArgumentsInfo *addtlInfo,SlabAllocator *alloc,
               uint32 dependsOnArrayCount,TTD_PTR_ID *dependsOnArray)

{
  DependsOnInfo *pDVar1;
  
  if (snpObject->SnapObjectTag != SnapHeapArgumentsObject) {
    TTDAbort_unrecoverable_error("Tag does not match.");
  }
  snpObject->AddtlSnapObjectInfo = addtlInfo;
  if ((dependsOnArrayCount != 0) && (dependsOnArray != (TTD_PTR_ID *)0x0)) {
    pDVar1 = (DependsOnInfo *)SlabAllocatorBase<0>::SlabAllocateTypeRawSize<16ul>(alloc);
    snpObject->OptDependsOnInfo = pDVar1;
    pDVar1->DepOnCount = dependsOnArrayCount;
    pDVar1->DepOnPtrArray = dependsOnArray;
    return;
  }
  TTDAbort_unrecoverable_error("Why are you calling this then?");
}

Assistant:

void StdExtractSetKindSpecificInfo(SnapObject* snpObject, T addtlInfo, SlabAllocator& alloc, uint32 dependsOnArrayCount, TTD_PTR_ID* dependsOnArray)
        {
            SnapObjectSetAddtlInfoAs<T, tag>(snpObject, addtlInfo);

            TTDAssert(dependsOnArrayCount != 0 && dependsOnArray != nullptr, "Why are you calling this then?");

            snpObject->OptDependsOnInfo = alloc.SlabAllocateStruct<DependsOnInfo>();
            snpObject->OptDependsOnInfo->DepOnCount = dependsOnArrayCount;
            snpObject->OptDependsOnInfo->DepOnPtrArray = dependsOnArray;
        }